

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O0

Var Js::IntlEngineInterfaceExtensionObject::EntryIntl_NormalizeLanguageTag
              (RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  uint uVar2;
  bool bVar3;
  UBool UVar4;
  int iVar5;
  CallFlags e;
  charcount_t cVar6;
  HRESULT HVar7;
  ScriptContext *pSVar8;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar9;
  Var pvVar10;
  undefined4 extraout_var;
  char *pcVar11;
  JavascriptLibrary *this_00;
  LPCSTR pCVar12;
  Recycler *pRVar13;
  charcount_t local_254;
  HRESULT hr;
  charcount_t canonicalized16Len;
  undefined8 local_248;
  TrackAllocData local_240;
  char16_t *local_218;
  char16 *canonicalized16;
  CHAR aCStack_208 [4];
  int toLangTagResultLength;
  char canonicalized [157];
  undefined8 uStack_148;
  int forLangTagResultLength;
  char localeID [157];
  uint local_9c;
  char16_t *pcStack_98;
  int parsedLength;
  undefined1 local_90 [8];
  WideToNarrow langtag8;
  JavascriptString *langtag;
  ScriptContext *pSStack_60;
  UErrorCode status;
  ScriptContext *scriptContext;
  CallInfo CStack_50;
  uint argCount;
  undefined1 local_48 [8];
  Arguments args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  pSVar8 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar8);
  pSVar8 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar8,(PVOID)0x0);
  iVar5 = _count_args(callInfo);
  values = _get_va(&stack0x00000000,iVar5);
  args.Values = (Type)callInfo;
  bVar3 = CallInfo::operator==((CallInfo *)(values + -1),callInfo);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x38c,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  CStack_50 = callInfo;
  Arguments::Arguments((Arguments *)local_48,callInfo,values);
  e = Js::operator&(callInfo._3_4_ &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar3 = operator!(e);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x38c,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  scriptContext._4_4_ = local_48._0_4_ & 0xffffff;
  pSStack_60 = RecyclableObject::GetScriptContext(function);
  if (scriptContext._4_4_ == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x38c,"(argCount > 0)","Should always have implicit \'this\'");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  if ((local_48._0_4_ & 0xffffff) == 2) {
    pvVar10 = Arguments::operator[]((Arguments *)local_48,1);
    bVar3 = VarIs<Js::JavascriptString>(pvVar10);
    if (bVar3) goto LAB_01097dd2;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar9 = 1;
  bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                              ,0x38f,"((args.Info.Count == 2 && VarIs<JavascriptString>(args[1])))",
                              "Intl platform function given bad arguments");
  if (!bVar3) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar9 = 0;
LAB_01097dd2:
  langtag._4_4_ = U_ZERO_ERROR;
  pvVar10 = Arguments::operator[]((Arguments *)local_48,1);
  langtag8._24_8_ = UnsafeVarTo<Js::JavascriptString>(pvVar10);
  iVar5 = (*(((JavascriptString *)langtag8._24_8_)->super_RecyclableObject).super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])();
  pcStack_98 = (char16_t *)CONCAT44(extraout_var,iVar5);
  cVar6 = JavascriptString::GetLength((JavascriptString *)langtag8._24_8_);
  utf8::NarrowWideConverter<utf8::malloc_allocator,_const_char16_t_*,_char_*,_unsigned_long>::
  NarrowWideConverter((NarrowWideConverter<utf8::malloc_allocator,_const_char16_t_*,_char_*,_unsigned_long>
                       *)local_90,&stack0xffffffffffffff68,(ulong)cVar6);
  local_9c = 0;
  localeID[0x88] = '\0';
  localeID[0x89] = '\0';
  localeID[0x8a] = '\0';
  localeID[0x8b] = '\0';
  localeID[0x8c] = '\0';
  localeID[0x8d] = '\0';
  localeID[0x8e] = '\0';
  localeID[0x8f] = '\0';
  localeID[0x90] = '\0';
  localeID[0x91] = '\0';
  localeID[0x92] = '\0';
  localeID[0x93] = '\0';
  localeID[0x94] = '\0';
  localeID[0x78] = '\0';
  localeID[0x79] = '\0';
  localeID[0x7a] = '\0';
  localeID[0x7b] = '\0';
  localeID[0x7c] = '\0';
  localeID[0x7d] = '\0';
  localeID[0x7e] = '\0';
  localeID[0x7f] = '\0';
  localeID[0x80] = '\0';
  localeID[0x81] = '\0';
  localeID[0x82] = '\0';
  localeID[0x83] = '\0';
  localeID[0x84] = '\0';
  localeID[0x85] = '\0';
  localeID[0x86] = '\0';
  localeID[0x87] = '\0';
  localeID[0x68] = '\0';
  localeID[0x69] = '\0';
  localeID[0x6a] = '\0';
  localeID[0x6b] = '\0';
  localeID[0x6c] = '\0';
  localeID[0x6d] = '\0';
  localeID[0x6e] = '\0';
  localeID[0x6f] = '\0';
  localeID[0x70] = '\0';
  localeID[0x71] = '\0';
  localeID[0x72] = '\0';
  localeID[0x73] = '\0';
  localeID[0x74] = '\0';
  localeID[0x75] = '\0';
  localeID[0x76] = '\0';
  localeID[0x77] = '\0';
  localeID[0x58] = '\0';
  localeID[0x59] = '\0';
  localeID[0x5a] = '\0';
  localeID[0x5b] = '\0';
  localeID[0x5c] = '\0';
  localeID[0x5d] = '\0';
  localeID[0x5e] = '\0';
  localeID[0x5f] = '\0';
  localeID[0x60] = '\0';
  localeID[0x61] = '\0';
  localeID[0x62] = '\0';
  localeID[99] = '\0';
  localeID[100] = '\0';
  localeID[0x65] = '\0';
  localeID[0x66] = '\0';
  localeID[0x67] = '\0';
  localeID[0x48] = '\0';
  localeID[0x49] = '\0';
  localeID[0x4a] = '\0';
  localeID[0x4b] = '\0';
  localeID[0x4c] = '\0';
  localeID[0x4d] = '\0';
  localeID[0x4e] = '\0';
  localeID[0x4f] = '\0';
  localeID[0x50] = '\0';
  localeID[0x51] = '\0';
  localeID[0x52] = '\0';
  localeID[0x53] = '\0';
  localeID[0x54] = '\0';
  localeID[0x55] = '\0';
  localeID[0x56] = '\0';
  localeID[0x57] = '\0';
  localeID[0x38] = '\0';
  localeID[0x39] = '\0';
  localeID[0x3a] = '\0';
  localeID[0x3b] = '\0';
  localeID[0x3c] = '\0';
  localeID[0x3d] = '\0';
  localeID[0x3e] = '\0';
  localeID[0x3f] = '\0';
  localeID[0x40] = '\0';
  localeID[0x41] = '\0';
  localeID[0x42] = '\0';
  localeID[0x43] = '\0';
  localeID[0x44] = '\0';
  localeID[0x45] = '\0';
  localeID[0x46] = '\0';
  localeID[0x47] = '\0';
  localeID[0x28] = '\0';
  localeID[0x29] = '\0';
  localeID[0x2a] = '\0';
  localeID[0x2b] = '\0';
  localeID[0x2c] = '\0';
  localeID[0x2d] = '\0';
  localeID[0x2e] = '\0';
  localeID[0x2f] = '\0';
  localeID[0x30] = '\0';
  localeID[0x31] = '\0';
  localeID[0x32] = '\0';
  localeID[0x33] = '\0';
  localeID[0x34] = '\0';
  localeID[0x35] = '\0';
  localeID[0x36] = '\0';
  localeID[0x37] = '\0';
  localeID[0x18] = '\0';
  localeID[0x19] = '\0';
  localeID[0x1a] = '\0';
  localeID[0x1b] = '\0';
  localeID[0x1c] = '\0';
  localeID[0x1d] = '\0';
  localeID[0x1e] = '\0';
  localeID[0x1f] = '\0';
  localeID[0x20] = '\0';
  localeID[0x21] = '\0';
  localeID[0x22] = '\0';
  localeID[0x23] = '\0';
  localeID[0x24] = '\0';
  localeID[0x25] = '\0';
  localeID[0x26] = '\0';
  localeID[0x27] = '\0';
  localeID[8] = '\0';
  localeID[9] = '\0';
  localeID[10] = '\0';
  localeID[0xb] = '\0';
  localeID[0xc] = '\0';
  localeID[0xd] = '\0';
  localeID[0xe] = '\0';
  localeID[0xf] = '\0';
  localeID[0x10] = '\0';
  localeID[0x11] = '\0';
  localeID[0x12] = '\0';
  localeID[0x13] = '\0';
  localeID[0x14] = '\0';
  localeID[0x15] = '\0';
  localeID[0x16] = '\0';
  localeID[0x17] = '\0';
  uStack_148 = 0;
  localeID[0] = '\0';
  localeID[1] = '\0';
  localeID[2] = '\0';
  localeID[3] = '\0';
  localeID[4] = '\0';
  localeID[5] = '\0';
  localeID[6] = '\0';
  localeID[7] = '\0';
  pcVar11 = utf8::NarrowWideConverter::operator_cast_to_char_((NarrowWideConverter *)local_90);
  iVar5 = uloc_forLanguageTag_70(pcVar11,&stack0xfffffffffffffeb8,0x9d,&local_9c,(long)&langtag + 4)
  ;
  if ((int)local_9c < 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0x39c,"(parsedLength >= 0)","parsedLength >= 0");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  uVar2 = local_9c;
  if ((langtag._4_4_ == U_ILLEGAL_ARGUMENT_ERROR) ||
     (cVar6 = JavascriptString::GetLength((JavascriptString *)langtag8._24_8_), uVar2 < cVar6)) {
    this_00 = ScriptContext::GetLibrary(pSStack_60);
    callInfo_local =
         (CallInfo)JavascriptLibraryBase::GetUndefined(&this_00->super_JavascriptLibraryBase);
  }
  else {
    if (langtag._4_4_ == U_MEMORY_ALLOCATION_ERROR) {
      Throw::OutOfMemory();
    }
    UVar4 = U_FAILURE(langtag._4_4_);
    uVar2 = local_9c;
    if ((UVar4 == '\0') && (langtag._4_4_ != U_STRING_NOT_TERMINATED_WARNING)) {
      if (((iVar5 < 0) ||
          (cVar6 = JavascriptString::GetLength((JavascriptString *)langtag8._24_8_), uVar2 != cVar6)
          ) && ((uVar2 = local_9c, iVar5 < 0 ||
                (cVar6 = JavascriptString::GetLength((JavascriptString *)langtag8._24_8_),
                uVar2 != cVar6)))) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                    ,0x3ad,
                                    "(forLangTagResultLength >= 0 && ((charcount_t) parsedLength) == langtag->GetLength())"
                                    ,
                                    "forLangTagResultLength >= 0 && ((charcount_t) parsedLength) == langtag->GetLength()"
                                   );
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      pCVar12 = (LPCSTR)u_errorName_70(langtag._4_4_);
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x3ad,"(false)",pCVar12);
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    canonicalized[0x88] = '\0';
    canonicalized[0x89] = '\0';
    canonicalized[0x8a] = '\0';
    canonicalized[0x8b] = '\0';
    canonicalized[0x8c] = '\0';
    canonicalized[0x8d] = '\0';
    canonicalized[0x8e] = '\0';
    canonicalized[0x8f] = '\0';
    canonicalized[0x90] = '\0';
    canonicalized[0x91] = '\0';
    canonicalized[0x92] = '\0';
    canonicalized[0x93] = '\0';
    canonicalized[0x94] = '\0';
    canonicalized[0x78] = '\0';
    canonicalized[0x79] = '\0';
    canonicalized[0x7a] = '\0';
    canonicalized[0x7b] = '\0';
    canonicalized[0x7c] = '\0';
    canonicalized[0x7d] = '\0';
    canonicalized[0x7e] = '\0';
    canonicalized[0x7f] = '\0';
    canonicalized[0x80] = '\0';
    canonicalized[0x81] = '\0';
    canonicalized[0x82] = '\0';
    canonicalized[0x83] = '\0';
    canonicalized[0x84] = '\0';
    canonicalized[0x85] = '\0';
    canonicalized[0x86] = '\0';
    canonicalized[0x87] = '\0';
    canonicalized[0x68] = '\0';
    canonicalized[0x69] = '\0';
    canonicalized[0x6a] = '\0';
    canonicalized[0x6b] = '\0';
    canonicalized[0x6c] = '\0';
    canonicalized[0x6d] = '\0';
    canonicalized[0x6e] = '\0';
    canonicalized[0x6f] = '\0';
    canonicalized[0x70] = '\0';
    canonicalized[0x71] = '\0';
    canonicalized[0x72] = '\0';
    canonicalized[0x73] = '\0';
    canonicalized[0x74] = '\0';
    canonicalized[0x75] = '\0';
    canonicalized[0x76] = '\0';
    canonicalized[0x77] = '\0';
    canonicalized[0x58] = '\0';
    canonicalized[0x59] = '\0';
    canonicalized[0x5a] = '\0';
    canonicalized[0x5b] = '\0';
    canonicalized[0x5c] = '\0';
    canonicalized[0x5d] = '\0';
    canonicalized[0x5e] = '\0';
    canonicalized[0x5f] = '\0';
    canonicalized[0x60] = '\0';
    canonicalized[0x61] = '\0';
    canonicalized[0x62] = '\0';
    canonicalized[99] = '\0';
    canonicalized[100] = '\0';
    canonicalized[0x65] = '\0';
    canonicalized[0x66] = '\0';
    canonicalized[0x67] = '\0';
    canonicalized[0x48] = '\0';
    canonicalized[0x49] = '\0';
    canonicalized[0x4a] = '\0';
    canonicalized[0x4b] = '\0';
    canonicalized[0x4c] = '\0';
    canonicalized[0x4d] = '\0';
    canonicalized[0x4e] = '\0';
    canonicalized[0x4f] = '\0';
    canonicalized[0x50] = '\0';
    canonicalized[0x51] = '\0';
    canonicalized[0x52] = '\0';
    canonicalized[0x53] = '\0';
    canonicalized[0x54] = '\0';
    canonicalized[0x55] = '\0';
    canonicalized[0x56] = '\0';
    canonicalized[0x57] = '\0';
    canonicalized[0x38] = '\0';
    canonicalized[0x39] = '\0';
    canonicalized[0x3a] = '\0';
    canonicalized[0x3b] = '\0';
    canonicalized[0x3c] = '\0';
    canonicalized[0x3d] = '\0';
    canonicalized[0x3e] = '\0';
    canonicalized[0x3f] = '\0';
    canonicalized[0x40] = '\0';
    canonicalized[0x41] = '\0';
    canonicalized[0x42] = '\0';
    canonicalized[0x43] = '\0';
    canonicalized[0x44] = '\0';
    canonicalized[0x45] = '\0';
    canonicalized[0x46] = '\0';
    canonicalized[0x47] = '\0';
    canonicalized[0x28] = '\0';
    canonicalized[0x29] = '\0';
    canonicalized[0x2a] = '\0';
    canonicalized[0x2b] = '\0';
    canonicalized[0x2c] = '\0';
    canonicalized[0x2d] = '\0';
    canonicalized[0x2e] = '\0';
    canonicalized[0x2f] = '\0';
    canonicalized[0x30] = '\0';
    canonicalized[0x31] = '\0';
    canonicalized[0x32] = '\0';
    canonicalized[0x33] = '\0';
    canonicalized[0x34] = '\0';
    canonicalized[0x35] = '\0';
    canonicalized[0x36] = '\0';
    canonicalized[0x37] = '\0';
    canonicalized[0x18] = '\0';
    canonicalized[0x19] = '\0';
    canonicalized[0x1a] = '\0';
    canonicalized[0x1b] = '\0';
    canonicalized[0x1c] = '\0';
    canonicalized[0x1d] = '\0';
    canonicalized[0x1e] = '\0';
    canonicalized[0x1f] = '\0';
    canonicalized[0x20] = '\0';
    canonicalized[0x21] = '\0';
    canonicalized[0x22] = '\0';
    canonicalized[0x23] = '\0';
    canonicalized[0x24] = '\0';
    canonicalized[0x25] = '\0';
    canonicalized[0x26] = '\0';
    canonicalized[0x27] = '\0';
    canonicalized[8] = '\0';
    canonicalized[9] = '\0';
    canonicalized[10] = '\0';
    canonicalized[0xb] = '\0';
    canonicalized[0xc] = '\0';
    canonicalized[0xd] = '\0';
    canonicalized[0xe] = '\0';
    canonicalized[0xf] = '\0';
    canonicalized[0x10] = '\0';
    canonicalized[0x11] = '\0';
    canonicalized[0x12] = '\0';
    canonicalized[0x13] = '\0';
    canonicalized[0x14] = '\0';
    canonicalized[0x15] = '\0';
    canonicalized[0x16] = '\0';
    canonicalized[0x17] = '\0';
    _aCStack_208 = 0;
    canonicalized[0] = '\0';
    canonicalized[1] = '\0';
    canonicalized[2] = '\0';
    canonicalized[3] = '\0';
    canonicalized[4] = '\0';
    canonicalized[5] = '\0';
    canonicalized[6] = '\0';
    canonicalized[7] = '\0';
    canonicalized16._4_4_ =
         uloc_toLanguageTag_70(&stack0xfffffffffffffeb8,aCStack_208,0x9d,1,(long)&langtag + 4);
    if (langtag._4_4_ == U_MEMORY_ALLOCATION_ERROR) {
      Throw::OutOfMemory();
    }
    UVar4 = U_FAILURE(langtag._4_4_);
    if ((UVar4 == '\0') && (langtag._4_4_ != U_STRING_NOT_TERMINATED_WARNING)) {
      if (((int)canonicalized16._4_4_ < 1) && ((int)canonicalized16._4_4_ < 1)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                    ,0x3b1,"(toLangTagResultLength > 0)","toLangTagResultLength > 0"
                                   );
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      pCVar12 = (LPCSTR)u_errorName_70(langtag._4_4_);
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x3b1,"(false)",pCVar12);
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    pRVar13 = ScriptContext::GetRecycler(pSStack_60);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_240,(type_info *)&char16_t::typeinfo,0,(long)(int)(canonicalized16._4_4_ + 1),
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
               ,0x3b4);
    pRVar13 = Memory::Recycler::TrackAllocInfo(pRVar13,&local_240);
    _hr = Memory::Recycler::AllocLeaf;
    local_248 = 0;
    local_218 = Memory::AllocateArray<Memory::Recycler,char16_t,false>
                          ((Memory *)pRVar13,(Recycler *)Memory::Recycler::AllocLeaf,0,
                           (long)(int)(canonicalized16._4_4_ + 1));
    local_254 = 0;
    HVar7 = utf8::NarrowStringToWideNoAlloc
                      (aCStack_208,(long)(int)canonicalized16._4_4_,local_218,
                       (long)(int)(canonicalized16._4_4_ + 1),&local_254);
    if ((HVar7 != 0) || (local_254 != canonicalized16._4_4_)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x3bd,
                                  "(hr == ((HRESULT)0x00000000L) && ((int) canonicalized16Len) == toLangTagResultLength)"
                                  ,
                                  "hr == ((HRESULT)0x00000000L) && ((int) canonicalized16Len) == toLangTagResultLength"
                                 );
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    callInfo_local =
         (CallInfo)JavascriptString::NewWithBuffer(local_218,canonicalized16._4_4_,pSStack_60);
  }
  utf8::NarrowWideConverter<utf8::malloc_allocator,_const_char16_t_*,_char_*,_unsigned_long>::
  ~NarrowWideConverter
            ((NarrowWideConverter<utf8::malloc_allocator,_const_char16_t_*,_char_*,_unsigned_long> *
             )local_90);
  return (Var)callInfo_local;
}

Assistant:

Var IntlEngineInterfaceExtensionObject::EntryIntl_NormalizeLanguageTag(RecyclableObject* function, CallInfo callInfo, ...)
    {
        EngineInterfaceObject_CommonFunctionProlog(function, callInfo);

#if defined(INTL_ICU)
        INTL_CHECK_ARGS(args.Info.Count == 2 && VarIs<JavascriptString>(args[1]));

        UErrorCode status = U_ZERO_ERROR;
        JavascriptString *langtag = UnsafeVarTo<JavascriptString>(args[1]);
        utf8::WideToNarrow langtag8(langtag->GetSz(), langtag->GetLength());

        // ICU doesn't have a full-fledged canonicalization implementation that correctly replaces all preferred values
        // and grandfathered tags, as required by #sec-canonicalizelanguagetag.
        // However, passing the locale through uloc_forLanguageTag -> uloc_toLanguageTag gets us most of the way there
        // by replacing some(?) values, correctly capitalizing the tag, and re-ordering extensions
        int parsedLength = 0;
        char localeID[ULOC_FULLNAME_CAPACITY] = { 0 };
        int forLangTagResultLength = uloc_forLanguageTag(langtag8, localeID, ULOC_FULLNAME_CAPACITY, &parsedLength, &status);
        AssertOrFailFast(parsedLength >= 0);
        if (status == U_ILLEGAL_ARGUMENT_ERROR || ((charcount_t) parsedLength) < langtag->GetLength())
        {
            // The string passed in to NormalizeLanguageTag has already passed IsStructurallyValidLanguageTag.
            // However, duplicate unicode extension keys, such as "de-u-co-phonebk-co-phonebk", are structurally
            // valid according to RFC5646 yet still trigger U_ILLEGAL_ARGUMENT_ERROR
            // V8 ~6.2 says that the above language tag is invalid, while SpiderMonkey ~58 handles it.
            // Until we have a more spec-compliant implementation of CanonicalizeLanguageTag, err on the side
            // of caution and say it is invalid.
            // We also check for parsedLength < langtag->GetLength() because there are cases when status == U_ZERO_ERROR
            // but the langtag was not valid, such as "en-tesTER-TESter" (OSS-Fuzz #6657).
            // NOTE: make sure we check for `undefined` at the platform.normalizeLanguageTag callsite.
            return scriptContext->GetLibrary()->GetUndefined();
        }

        // forLangTagResultLength can be 0 if langtag is "und".
        // uloc_toLanguageTag("") returns "und", so this works out (forLanguageTag can return >= 0 but toLanguageTag must return > 0)
        ICU_ASSERT(status, forLangTagResultLength >= 0 && ((charcount_t) parsedLength) == langtag->GetLength());

        char canonicalized[ULOC_FULLNAME_CAPACITY] = { 0 };
        int toLangTagResultLength = uloc_toLanguageTag(localeID, canonicalized, ULOC_FULLNAME_CAPACITY, true, &status);
        ICU_ASSERT(status, toLangTagResultLength > 0);

        // allocate toLangTagResultLength + 1 to leave room for null terminator
        char16 *canonicalized16 = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), char16, toLangTagResultLength + 1);
        charcount_t canonicalized16Len = 0;
        HRESULT hr = utf8::NarrowStringToWideNoAlloc(
            canonicalized,
            toLangTagResultLength,
            canonicalized16,
            toLangTagResultLength + 1,
            &canonicalized16Len
        );
        AssertOrFailFast(hr == S_OK && ((int) canonicalized16Len) == toLangTagResultLength);

        return JavascriptString::NewWithBuffer(canonicalized16, toLangTagResultLength, scriptContext);
#else
        if (args.Info.Count < 2 || !VarIs<JavascriptString>(args.Values[1]))
        {
            // NormalizeLanguageTag of undefined or non-string is undefined
            return scriptContext->GetLibrary()->GetUndefined();
        }

        JavascriptString *argString = VarTo<JavascriptString>(args.Values[1]);
        JavascriptString *retVal;
        HRESULT hr;
        AutoHSTRING str;
        hr = GetWindowsGlobalizationAdapter(scriptContext)->NormalizeLanguageTag(scriptContext, argString->GetSz(), &str);
        DelayLoadWindowsGlobalization *wsl = scriptContext->GetThreadContext()->GetWindowsGlobalizationLibrary();
        PCWSTR strBuf = wsl->WindowsGetStringRawBuffer(*str, NULL);
        retVal = Js::JavascriptString::NewCopySz(strBuf, scriptContext);
        if (FAILED(hr))
        {
            HandleOOMSOEHR(hr);
            //If we can't normalize the tag; return undefined.
            return scriptContext->GetLibrary()->GetUndefined();
        }

        return retVal;
#endif
    }